

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

vector<soul::Type,_std::allocator<soul::Type>_> * __thiscall
soul::AST::EndpointDetails::getResolvedDataTypes
          (vector<soul::Type,_std::allocator<soul::Type>_> *__return_storage_ptr__,
          EndpointDetails *this)

{
  pool_ref<soul::AST::Expression> *ppVar1;
  size_t sVar2;
  long *plVar3;
  char cVar4;
  long lVar5;
  Type TStack_48;
  
  (__return_storage_ptr__->super__Vector_base<soul::Type,_std::allocator<soul::Type>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<soul::Type,_std::allocator<soul::Type>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<soul::Type,_std::allocator<soul::Type>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<soul::Type,_std::allocator<soul::Type>_>::reserve
            (__return_storage_ptr__,(this->dataTypes).numActive);
  ppVar1 = (this->dataTypes).items;
  sVar2 = (this->dataTypes).numActive;
  lVar5 = 0;
  while( true ) {
    if (sVar2 << 3 == lVar5) {
      return __return_storage_ptr__;
    }
    plVar3 = *(long **)((long)&ppVar1->object + lVar5);
    if ((int)plVar3[5] != 1) break;
    cVar4 = (**(code **)(*plVar3 + 0x18))();
    if (cVar4 == '\0') break;
    (**(code **)(**(long **)((long)&ppVar1->object + lVar5) + 0x28))(&TStack_48);
    std::vector<soul::Type,_std::allocator<soul::Type>_>::emplace_back<soul::Type>
              (__return_storage_ptr__,&TStack_48);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&TStack_48.structure);
    lVar5 = lVar5 + 8;
  }
  throwInternalCompilerError("isResolvedAsType (t.get())","getResolvedDataTypes",0x3e2);
}

Assistant:

std::vector<Type> getResolvedDataTypes() const
        {
            std::vector<Type> types;
            types.reserve (dataTypes.size());

            for (auto& t : dataTypes)
            {
                SOUL_ASSERT (isResolvedAsType (t.get()));
                types.push_back (t->resolveAsType());
            }

            return types;
        }